

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_serializer_boost_po::serialize<int>
          (options_serializer_boost_po *this,typed_option<int> *typed_option)

{
  int *piVar1;
  ostream *this_00;
  int iVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18," --",3);
  this_00 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&this->field_0x18,
                       (typed_option->super_base_option).m_name._M_dataplus._M_p,
                       (typed_option->super_base_option).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  piVar1 = (typed_option->m_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (piVar1 == (int *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *piVar1;
  }
  std::ostream::operator<<(this_00,iVar2);
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }